

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicLoad(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,BinaryenType type,
                  BinaryenExpressionRef ptr,char *memoryName)

{
  char *ptr_00;
  uint bytes_00;
  Load *pLVar1;
  Name memory;
  Type local_48;
  Address local_40;
  Builder local_38;
  char *local_30;
  char *memoryName_local;
  BinaryenExpressionRef ptr_local;
  BinaryenType type_local;
  uint32_t offset_local;
  uint32_t bytes_local;
  BinaryenModuleRef module_local;
  
  local_30 = memoryName;
  memoryName_local = (char *)ptr;
  ptr_local = (BinaryenExpressionRef)type;
  type_local._0_4_ = offset;
  type_local._4_4_ = bytes;
  _offset_local = module;
  wasm::Builder::Builder(&local_38,module);
  bytes_00 = type_local._4_4_;
  wasm::Address::Address(&local_40,(ulong)(uint32_t)type_local);
  ptr_00 = memoryName_local;
  wasm::Type::Type(&local_48,(TypeID)ptr_local);
  memory = getMemoryName(_offset_local,local_30);
  pLVar1 = wasm::Builder::makeAtomicLoad
                     (&local_38,bytes_00,local_40,(Expression *)ptr_00,local_48,memory);
  return (BinaryenExpressionRef)pLVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicLoad(BinaryenModuleRef module,
                                         uint32_t bytes,
                                         uint32_t offset,
                                         BinaryenType type,
                                         BinaryenExpressionRef ptr,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicLoad(bytes,
                      offset,
                      (Expression*)ptr,
                      Type(type),
                      getMemoryName(module, memoryName)));
}